

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsetools.c
# Opt level: O3

int has_xml_content_type(http_message_t *hmsg)

{
  parse_status_t pVar1;
  http_header_t *phVar2;
  memptr hdr_value;
  memptr local_10;
  
  if (hmsg == (http_message_t *)0x0) {
    __assert_fail("hmsg",".upnp/src/genlib/net/http/parsetools.c",0x34,
                  "int has_xml_content_type(http_message_t *)");
  }
  phVar2 = httpmsg_find_hdr(hmsg,4,&local_10);
  if ((phVar2 != (http_header_t *)0x0) &&
     (pVar1 = matchstr(local_10.buf,local_10.length,"%itext%w/%wxml"), pVar1 == PARSE_OK)) {
    return 1;
  }
  return 0;
}

Assistant:

int has_xml_content_type(http_message_t *hmsg)
{
	memptr hdr_value;

	assert(hmsg);

	/* find 'content-type' header which must have text/xml */
	if (httpmsg_find_hdr(hmsg, HDR_CONTENT_TYPE, &hdr_value)) {
		switch (matchstr(
			hdr_value.buf, hdr_value.length, "%itext%w/%wxml")) {
		case PARSE_OK:
			return 1;
		default:
			break;
		}
	}
	return 0;
}